

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

int Super_CheckTimeout(ProgressBar *pPro,Super_Man_t *pMan)

{
  abctime aVar1;
  abctime aVar2;
  int nItemsCur;
  abctime TimeNow;
  Super_Man_t *pMan_local;
  ProgressBar *pPro_local;
  
  aVar1 = Abc_Clock();
  if (pMan->TimePrint < aVar1) {
    nItemsCur = pMan->TimeSec + 1;
    pMan->TimeSec = nItemsCur;
    Extra_ProgressBarUpdate(pPro,nItemsCur,(char *)0x0);
    aVar2 = Abc_Clock();
    pMan->TimePrint = aVar2 + 1000000;
  }
  if ((pMan->TimeStop == 0) || (aVar1 <= pMan->TimeStop)) {
    pMan->nTried = pMan->nTried + 1;
    pPro_local._4_4_ = 0;
  }
  else {
    printf("Timeout!\n");
    pPro_local._4_4_ = 1;
  }
  return pPro_local._4_4_;
}

Assistant:

int Super_CheckTimeout( ProgressBar * pPro, Super_Man_t * pMan )
{
    abctime TimeNow = Abc_Clock();
    if ( TimeNow > pMan->TimePrint )
    {
        Extra_ProgressBarUpdate( pPro, ++pMan->TimeSec, NULL );
        pMan->TimePrint = Abc_Clock() + CLOCKS_PER_SEC;
    }
    if ( pMan->TimeStop && TimeNow > pMan->TimeStop )
    {
        printf ("Timeout!\n");
        return 1;
    }
    pMan->nTried++;
    return 0;
}